

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int attlist1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  code *pcVar1;
  ENCODING *enc_local;
  char *end_local;
  char *ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  switch(tok) {
  case 0xf:
    state_local._4_4_ = 0x21;
    break;
  default:
    state_local._4_4_ = common(state,tok);
    break;
  case 0x11:
    pcVar1 = externalSubset1;
    if (state->documentEntity != 0) {
      pcVar1 = internalSubset;
    }
    state->handler = pcVar1;
    state_local._4_4_ = 0x21;
    break;
  case 0x12:
  case 0x29:
    state->handler = attlist2;
    state_local._4_4_ = 0x16;
  }
  return state_local._4_4_;
}

Assistant:

static int PTRCALL
attlist1(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_DECL_CLOSE:
    setTopLevel(state);
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = attlist2;
    return XML_ROLE_ATTRIBUTE_NAME;
  }
  return common(state, tok);
}